

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void image_manipulation::bilinear_resize
               (clip_image_u8 *src,clip_image_u8 *dst,int target_width,int target_height)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int x;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  dst->nx = target_width;
  dst->ny = target_height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&dst->buf,(long)(target_width * target_height * 3));
  iVar1 = src->nx;
  iVar2 = src->ny;
  uVar9 = 0;
  uVar5 = 0;
  if (0 < target_width) {
    uVar5 = (ulong)(uint)target_width;
  }
  uVar7 = (ulong)(uint)target_height;
  if (target_height < 1) {
    uVar7 = uVar9;
  }
  for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
    fVar14 = (float)(int)uVar4 * ((float)(iVar2 + -1) / (float)target_height);
    uVar8 = uVar9;
    for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      fVar15 = (float)(int)uVar10 * ((float)(iVar1 + -1) / (float)target_width);
      iVar11 = (int)fVar15;
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        iVar13 = src->nx * (int)fVar14;
        puVar3 = (src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar6 = src->nx * ((int)fVar14 + 1);
        fVar16 = ((float)puVar3[lVar12 + (long)(iVar13 + iVar11 + 1) * 3] -
                 (float)puVar3[lVar12 + (long)(iVar11 + iVar13) * 3]) *
                 (fVar15 - (float)(int)fVar15) + (float)puVar3[lVar12 + (long)(iVar11 + iVar13) * 3]
        ;
        (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12 + uVar8] =
             (uchar)(int)(((((float)puVar3[lVar12 + (long)(iVar6 + iVar11 + 1) * 3] -
                            (float)puVar3[lVar12 + (long)(iVar6 + iVar11) * 3]) *
                            (fVar15 - (float)(int)fVar15) +
                           (float)puVar3[lVar12 + (long)(iVar6 + iVar11) * 3]) - fVar16) *
                          (fVar14 - (float)(int)fVar14) + fVar16);
      }
      uVar8 = uVar8 + 3;
    }
    uVar9 = uVar9 + (long)target_width * 3;
  }
  return;
}

Assistant:

static void bilinear_resize(const clip_image_u8& src, clip_image_u8& dst, int target_width, int target_height) {
        dst.nx = target_width;
        dst.ny = target_height;
        dst.buf.resize(3 * target_width * target_height);

        float x_ratio = static_cast<float>(src.nx - 1) / target_width;
        float y_ratio = static_cast<float>(src.ny - 1) / target_height;

        for (int y = 0; y < target_height; y++) {
            for (int x = 0; x < target_width; x++) {
                float px = x_ratio * x;
                float py = y_ratio * y;
                int x_floor = static_cast<int>(px);
                int y_floor = static_cast<int>(py);
                float x_lerp = px - x_floor;
                float y_lerp = py - y_floor;

                for (int c = 0; c < 3; c++) {
                    float top = lerp(
                        static_cast<float>(src.buf[3 * (y_floor * src.nx + x_floor) + c]),
                        static_cast<float>(src.buf[3 * (y_floor * src.nx + (x_floor + 1)) + c]),
                        x_lerp
                    );
                    float bottom = lerp(
                        static_cast<float>(src.buf[3 * ((y_floor + 1) * src.nx + x_floor) + c]),
                        static_cast<float>(src.buf[3 * ((y_floor + 1) * src.nx + (x_floor + 1)) + c]),
                        x_lerp
                    );
                    dst.buf[3 * (y * target_width + x) + c] = static_cast<uint8_t>(lerp(top, bottom, y_lerp));
                }
            }
        }
    }